

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void set_date_time(uchar *p,time_t t)

{
  uchar *in_RDI;
  tm_conflict tm;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  long local_20;
  
  get_tmfromtime((tm_conflict *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (time_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  set_digit(in_RDI,4,local_34 + 0x76c);
  set_digit(in_RDI + 4,2,local_38 + 1);
  set_digit(in_RDI + 6,2,in_stack_ffffffffffffffc4);
  set_digit(in_RDI + 8,2,in_stack_ffffffffffffffc0);
  set_digit(in_RDI + 10,2,in_stack_ffffffffffffffbc);
  set_digit(in_RDI + 0xc,2,in_stack_ffffffffffffffb8);
  set_digit(in_RDI + 0xe,2,0);
  set_num_712(in_RDI + 0x10,(char)(local_20 / 900));
  return;
}

Assistant:

static void
set_date_time(unsigned char *p, time_t t)
{
	struct tm tm;

	get_tmfromtime(&tm, &t);
	set_digit(p, 4, tm.tm_year + 1900);
	set_digit(p+4, 2, tm.tm_mon + 1);
	set_digit(p+6, 2, tm.tm_mday);
	set_digit(p+8, 2, tm.tm_hour);
	set_digit(p+10, 2, tm.tm_min);
	set_digit(p+12, 2, tm.tm_sec);
	set_digit(p+14, 2, 0);
	set_num_712(p+16, (char)(get_gmoffset(&tm)/(60*15)));
}